

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_deny(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var4;
  CHAR_DATA *victim;
  char query [4608];
  char *cname;
  char buf [4608];
  char arg [4608];
  undefined4 in_stack_ffffffffffffc9c8;
  undefined4 in_stack_ffffffffffffc9cc;
  undefined1 fBoth;
  char *in_stack_ffffffffffffc9d0;
  CHAR_DATA *in_stack_ffffffffffffc9d8;
  char *in_stack_ffffffffffffc9e0;
  char *in_stack_ffffffffffffc9f8;
  undefined1 in_stack_ffffffffffffcb3f;
  char *in_stack_ffffffffffffcb40;
  CHAR_DATA *in_stack_ffffffffffffcb48;
  char local_2418 [52];
  int in_stack_ffffffffffffdc1c;
  long in_stack_ffffffffffffdc20;
  long in_stack_ffffffffffffdc28;
  OBJ_DATA *in_stack_ffffffffffffdc30;
  CHAR_DATA *in_stack_ffffffffffffdc38;
  char *in_stack_ffffffffffffdc40;
  char *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  char in_stack_ffffffffffffede8;
  undefined7 in_stack_ffffffffffffede9;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  undefined1 in_stack_ffffffffffffffef;
  
  one_argument(in_stack_ffffffffffffc9d0,
               (char *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
  }
  else {
    ch_00 = get_char_world(in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
    }
    else {
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
      if (bVar1) {
        send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
      }
      else {
        iVar2 = get_trust((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8)
                         );
        iVar3 = get_trust((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffc9c8));
        if (iVar2 < iVar3) {
          _Var4 = std::pow<int,int>(0,0x5879d3);
          fBoth = (undefined1)((uint)iVar2 >> 0x18);
          ch_00->act[0] = (long)_Var4 | ch_00->act[0];
          send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
          sprintf(local_2418,"$N denies access to %s",ch_00->name);
          wiznet(in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30,
                 in_stack_ffffffffffffdc28,in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc1c);
          send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
          save_char_obj((CHAR_DATA *)buf._56_8_);
          stop_fighting(ch_00,(bool)fBoth);
          ch_00->pause = 0;
          if (ch_00->desc != (DESCRIPTOR_DATA *)0x0) {
            sprintf(&stack0xffffffffffffc9d8,
                    "UPDATE sitetracker SET denials=denials+1 WHERE \'%s\' RLIKE site_name",
                    ch_00->desc->host);
            one_query((char *)ch_00);
          }
          sprintf(local_2418,"AUTO: Denied by %s.\n\r",*(undefined8 *)(in_RDI + 0xf0));
          add_history(in_stack_ffffffffffffedf0,
                      (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
                      in_stack_ffffffffffffede0);
          palloc_string(in_stack_ffffffffffffc9f8);
          do_quit_new(in_stack_ffffffffffffcb48,in_stack_ffffffffffffcb40,
                      (bool)in_stack_ffffffffffffcb3f);
          delete_char(in_RSI,(bool)in_stack_ffffffffffffffef);
        }
        else {
          send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
        }
      }
    }
  }
  return;
}

Assistant:

void do_deny(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH], *cname;
	char query[MSL];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Deny whom?\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	if (get_trust(victim) >= get_trust(ch))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	SET_BIT(victim->act, PLR_DENY);

	send_to_char("You are denied access!\n\r", victim);

	sprintf(buf, "$N denies access to %s", victim->name);
	wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);

	send_to_char("OK.\n\r", ch);

	save_char_obj(victim);

	stop_fighting(victim, true);

	victim->pause = 0;

	// add to denial #
	if (victim->desc)
	{
		sprintf(query, "UPDATE sitetracker SET denials=denials+1 WHERE '%s' RLIKE site_name", victim->desc->host);
		one_query(query);
	}

	sprintf(buf, "AUTO: Denied by %s.\n\r", ch->true_name);
	add_history(nullptr, victim, buf);

	cname = palloc_string(victim->true_name);

	do_quit_new(victim, "", true);
	delete_char(cname, true);
}